

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

Float __thiscall pbrt::Triangle::SolidAngle(Triangle *this,Point3f *p)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Float FVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Vector3f a;
  Vector3f b;
  Vector3f c;
  
  fVar1 = (p->super_Tuple3<pbrt::Point3,_float>).z;
  uVar2 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar3 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar16._4_4_ = uVar3;
  auVar16._0_4_ = uVar2;
  auVar16._8_8_ = 0;
  lVar4 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar5 = (long)this->triIndex;
  lVar6 = *(long *)(lVar4 + 8);
  lVar4 = *(long *)(lVar4 + 0x10);
  lVar7 = (long)*(int *)(lVar6 + lVar5 * 0xc);
  lVar8 = (long)*(int *)(lVar6 + 4 + lVar5 * 0xc);
  lVar6 = (long)*(int *)(lVar6 + 8 + lVar5 * 0xc);
  fVar15 = *(float *)(lVar4 + 8 + lVar7 * 0xc) - fVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(lVar4 + lVar7 * 0xc);
  auVar19 = vsubps_avx(auVar10,auVar16);
  auVar13._0_4_ = auVar19._0_4_ * auVar19._0_4_;
  auVar13._4_4_ = auVar19._4_4_ * auVar19._4_4_;
  auVar13._8_4_ = auVar19._8_4_ * auVar19._8_4_;
  auVar13._12_4_ = auVar19._12_4_ * auVar19._12_4_;
  auVar10 = vhaddps_avx(auVar13,auVar13);
  auVar10 = ZEXT416((uint)(auVar10._0_4_ + fVar15 * fVar15));
  auVar10 = vsqrtss_avx(auVar10,auVar10);
  fVar12 = auVar10._0_4_;
  auVar18._4_4_ = fVar12;
  auVar18._0_4_ = fVar12;
  auVar18._8_4_ = fVar12;
  auVar18._12_4_ = fVar12;
  a.super_Tuple3<pbrt::Vector3,_float>.z = fVar15 / fVar12;
  fVar15 = *(float *)(lVar4 + 8 + lVar8 * 0xc) - fVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(lVar4 + lVar8 * 0xc);
  fVar1 = *(float *)(lVar4 + 8 + lVar6 * 0xc) - fVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(lVar4 + lVar6 * 0xc);
  auVar10 = vdivps_avx(auVar19,auVar18);
  auVar13 = vsubps_avx(auVar11,auVar16);
  auVar14 = vsubps_avx(auVar14,auVar16);
  auVar19._0_4_ = auVar13._0_4_ * auVar13._0_4_;
  auVar19._4_4_ = auVar13._4_4_ * auVar13._4_4_;
  auVar19._8_4_ = auVar13._8_4_ * auVar13._8_4_;
  auVar19._12_4_ = auVar13._12_4_ * auVar13._12_4_;
  auVar17._0_4_ = auVar14._0_4_ * auVar14._0_4_;
  auVar17._4_4_ = auVar14._4_4_ * auVar14._4_4_;
  auVar17._8_4_ = auVar14._8_4_ * auVar14._8_4_;
  auVar17._12_4_ = auVar14._12_4_ * auVar14._12_4_;
  auVar19 = vhaddps_avx(auVar19,auVar19);
  auVar11 = vhaddps_avx(auVar17,auVar17);
  auVar19 = ZEXT416((uint)(fVar15 * fVar15 + auVar19._0_4_));
  auVar19 = vsqrtss_avx(auVar19,auVar19);
  fVar12 = auVar19._0_4_;
  auVar21._4_4_ = fVar12;
  auVar21._0_4_ = fVar12;
  auVar21._8_4_ = fVar12;
  auVar21._12_4_ = fVar12;
  b.super_Tuple3<pbrt::Vector3,_float>.z = fVar15 / fVar12;
  auVar19 = vdivps_avx(auVar13,auVar21);
  auVar11 = ZEXT416((uint)(auVar11._0_4_ + fVar1 * fVar1));
  auVar11 = vsqrtss_avx(auVar11,auVar11);
  fVar15 = auVar11._0_4_;
  auVar20._4_4_ = fVar15;
  auVar20._0_4_ = fVar15;
  auVar20._8_4_ = fVar15;
  auVar20._12_4_ = fVar15;
  c.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 / fVar15;
  auVar11 = vdivps_avx(auVar14,auVar20);
  a.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar10._0_8_;
  b.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar19._0_8_;
  c.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar11._0_8_;
  FVar9 = SphericalTriangleArea(a,b,c);
  return FVar9;
}

Assistant:

PBRT_CPU_GPU
    const TriangleMesh *GetMesh() const {
#ifdef PBRT_IS_GPU_CODE
        return (*allTriangleMeshesGPU)[meshIndex];
#else
        return (*allMeshes)[meshIndex];
#endif
    }